

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

void Omega_h::transfer_integ_error
               (Mesh *old_mesh,Mesh *new_mesh,CavsByBdryStatus *cavs,Reals *old_elem_densities,
               Reals *new_elem_densities,string *error_name,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,ConservedBools conserved_bools)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CommPtr *pCVar2;
  int *piVar3;
  LOs *pLVar4;
  uint ent_dim;
  Alloc *pAVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  undefined8 uVar9;
  Alloc *pAVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  void *pvVar18;
  Alloc *pAVar19;
  LO LVar20;
  int iVar21;
  Int IVar22;
  Tag<double> *pTVar23;
  Now b;
  pointer psVar24;
  Alloc *pAVar25;
  size_t sVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  Real RVar31;
  Read<double> new_cav_elem_sizes;
  Read<double> old_cav_elem_densities;
  Write<double> new_elem_errors_w;
  Reals new_cav_elem_integrals;
  Reals old_elem_sizes;
  Reals cav_error_densities_1;
  Read<double> old_cav_elem_sizes;
  Read<double> new_cav_sizes_1;
  Reals new_elem_errors;
  Reals old_cav_elem_integrals;
  Read<double> new_cav_elem_densities;
  Reals new_elem_sizes;
  Graph keys2new_elems;
  Read<double> cav_elem_error_densities_1;
  Read<double> old_cav_errors;
  Graph keys2old_elems;
  Read<double> same_errors;
  Read<double> old_elem_errors;
  Reals cav_elem_errors;
  Read<double> cav_elem_error_densities;
  Reals cav_error_densities;
  Read<double> new_cav_sizes;
  Read<double> cav_errors;
  Read<double> new_cav_integrals;
  Read<double> old_cav_integrals;
  undefined1 local_648 [32];
  Alloc *local_628;
  Int local_61c;
  Alloc *local_618;
  Reals local_610;
  Mesh *local_600;
  Mesh *local_5f8;
  undefined1 local_5f0 [24];
  Alloc *local_5d8;
  Read<signed_char> local_5d0;
  LOs local_5c0;
  Read<signed_char> local_5b0;
  LOs local_5a0;
  Read<signed_char> local_590;
  LOs local_580;
  Alloc *local_570;
  Alloc *local_568;
  Write<double> local_560;
  Read<signed_char> local_550;
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  LOs local_510;
  Read<signed_char> local_500;
  pointer local_4f0;
  element_type *local_4e8;
  Alloc *local_4e0;
  Alloc *local_4d8;
  undefined1 local_4d0 [32];
  element_type *local_4b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  element_type *local_4a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  Read<signed_char> local_490;
  element_type *local_480;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_478;
  Alloc *local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  Write<signed_char> local_460;
  Read<signed_char> local_450;
  element_type *local_440;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_438;
  element_type *local_430;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_428;
  Alloc *local_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_418;
  Alloc *local_410;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  element_type *local_400;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  Alloc *local_3f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  element_type *local_3e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  Alloc *local_3d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  Alloc *local_3c0;
  uint local_3b4;
  Alloc *local_3b0 [2];
  Alloc *local_3a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_398;
  Alloc *local_390;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_388;
  Alloc *local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_378;
  Alloc *local_370;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  Alloc *local_360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  element_type *local_350;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  LOs local_340;
  Read<signed_char> local_330;
  LOs local_320;
  Write<signed_char> local_310;
  LOs local_300;
  undefined1 local_2f0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  LOs local_2d0;
  Read<signed_char> local_2c0;
  Reals local_2b0;
  Reals local_2a0;
  Read<signed_char> local_290;
  LOs local_280;
  Read<double> local_270;
  Read<double> local_260;
  Read<signed_char> local_250;
  LOs local_240;
  Read<signed_char> local_230;
  LOs local_220;
  Read<double> local_210;
  Read<double> local_200;
  Alloc *local_1f0 [2];
  Cavs local_1e0;
  Read<double> local_1a0;
  Write<double> local_190;
  element_type *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  Alloc *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  Alloc *local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  Write<signed_char> local_150;
  Read<signed_char> local_140;
  element_type *local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  Alloc *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  Read<signed_char> local_110;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  Alloc *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [16];
  element_type *local_c0;
  _Base_ptr local_b8;
  Alloc *local_b0;
  _Base_ptr local_a8;
  Reals *local_a0;
  Alloc *local_98;
  Write<signed_char> local_90;
  Cavs local_80;
  Alloc *local_40 [2];
  
  local_368._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cavs;
  local_358._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_elem_densities;
  local_a0 = old_elem_densities;
  begin_code("transfer_integ_error",(char *)0x0);
  local_3b4 = old_mesh->dim_;
  if (3 < local_3b4) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  local_360 = (Alloc *)error_name;
  pTVar23 = Mesh::get_tag<double>(old_mesh,local_3b4,error_name);
  local_61c = TagBase::ncomps(&pTVar23->super_TagBase);
  Tag<double>::array(pTVar23);
  local_5f8 = new_mesh;
  LVar20 = Mesh::nelems(new_mesh);
  local_4d0._0_8_ = (Alloc *)(local_4d0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"");
  Write<double>::Write(&local_560,LVar20 * local_61c,0.0,(string *)local_4d0);
  if ((Alloc *)local_4d0._0_8_ != (Alloc *)(local_4d0 + 0x10)) {
    operator_delete((void *)local_4d0._0_8_,(ulong)(local_4d0._16_8_ + 1));
  }
  local_320.write_.shared_alloc_.alloc = (same_ents2old_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_320.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_320.write_.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_320.write_.shared_alloc_.alloc =
           (Alloc *)((long)(((element_type *)local_320.write_.shared_alloc_.alloc)->parent_comm_).
                           super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8
                    + 1);
    }
    else {
      *(int *)&((element_type *)local_320.write_.shared_alloc_.alloc)->items2content_[0].write_.
               shared_alloc_.alloc =
           *(int *)&((element_type *)local_320.write_.shared_alloc_.alloc)->items2content_[0].write_
                    .shared_alloc_.alloc + 1;
    }
  }
  local_320.write_.shared_alloc_.direct_ptr = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
  local_140.write_.shared_alloc_.alloc = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_140.write_.shared_alloc_.alloc = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_140.write_.shared_alloc_.direct_ptr = local_118._M_pi;
  unmap<double>((Omega_h *)&local_90,&local_320,&local_140,local_61c);
  read<double>((Omega_h *)&local_130,&local_90);
  if (((ulong)local_90.shared_alloc_.alloc & 7) == 0 && local_90.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar3 = &(local_90.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_90.shared_alloc_.alloc);
      operator_delete(local_90.shared_alloc_.alloc,0x48);
    }
  }
  pAVar25 = local_140.write_.shared_alloc_.alloc;
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_140.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
      operator_delete(pAVar25,0x48);
    }
  }
  pAVar25 = local_320.write_.shared_alloc_.alloc;
  if (((ulong)local_320.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_320.write_.shared_alloc_.alloc != (element_type *)0x0) {
    pLVar4 = (LOs *)&(local_320.write_.shared_alloc_.alloc)->use_count;
    *(int *)&(pLVar4->write_).shared_alloc_.alloc =
         *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc(local_320.write_.shared_alloc_.alloc);
      operator_delete(pAVar25,0x48);
    }
  }
  local_330.write_.shared_alloc_.alloc = (Alloc *)local_130;
  if (((ulong)local_130 & 7) == 0 && local_130 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_330.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_130->parent_comm_).
                           super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8
                    + 1);
    }
    else {
      *(int *)&local_130->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_130->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  local_330.write_.shared_alloc_.direct_ptr = local_128._M_pi;
  local_340.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_340.write_.shared_alloc_.alloc & 7) == 0 &&
      local_340.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_340.write_.shared_alloc_.alloc =
           (Alloc *)((local_340.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_340.write_.shared_alloc_.alloc)->use_count =
           (local_340.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_340.write_.shared_alloc_.direct_ptr = (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
  local_150.shared_alloc_.alloc = local_560.shared_alloc_.alloc;
  if (((ulong)local_560.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_560.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_150.shared_alloc_.alloc =
           (Alloc *)((long)(((CommPtr *)&(local_560.shared_alloc_.alloc)->size)->
                           super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8
                    + 1);
    }
    else {
      *(int *)&(((LOs *)&(local_560.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.alloc =
           *(int *)&(((LOs *)&(local_560.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.
                    alloc + 1;
    }
  }
  local_150.shared_alloc_.direct_ptr = local_560.shared_alloc_.direct_ptr;
  map_into<double>(&local_330,&local_340,&local_150,local_61c);
  pAVar25 = local_150.shared_alloc_.alloc;
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_150.shared_alloc_.alloc != (element_type *)0x0) {
    pLVar4 = (LOs *)&(local_150.shared_alloc_.alloc)->use_count;
    *(int *)&(pLVar4->write_).shared_alloc_.alloc =
         *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc(local_150.shared_alloc_.alloc);
      operator_delete(pAVar25,0x48);
    }
  }
  pAVar25 = local_340.write_.shared_alloc_.alloc;
  if (((ulong)local_340.write_.shared_alloc_.alloc & 7) == 0 &&
      local_340.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_340.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_340.write_.shared_alloc_.alloc);
      operator_delete(pAVar25,0x48);
    }
  }
  pAVar25 = local_330.write_.shared_alloc_.alloc;
  if (((ulong)local_330.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_330.write_.shared_alloc_.alloc != (element_type *)0x0) {
    pLVar4 = (LOs *)&(local_330.write_.shared_alloc_.alloc)->use_count;
    *(int *)&(pLVar4->write_).shared_alloc_.alloc =
         *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc(local_330.write_.shared_alloc_.alloc);
      operator_delete(pAVar25,0x48);
    }
  }
  psVar24 = (pointer)0x0;
  local_378._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_520;
  local_390 = (Alloc *)local_5f0;
  local_370 = (Alloc *)local_d0;
  local_380 = (Alloc *)local_f0;
  local_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100;
  local_398._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2f0 + 0x10);
  local_3a0 = (Alloc *)local_2f0;
  local_600 = old_mesh;
  do {
    local_4f0 = psVar24;
    if (conserved_bools.this_time._M_elems
        [(long)&(psVar24->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr] == false) {
      pAVar25 = *(Alloc **)((long)local_368._M_pi + (long)psVar24 * 0x48 + 0x18);
      local_98 = *(Alloc **)((long)local_368._M_pi + (long)psVar24 * 0x48 + 0x20);
      if (pAVar25 != local_98) {
        do {
          local_4d0._0_8_ = pAVar25->size;
          if ((local_4d0._0_8_ & 7) == 0 && (Alloc *)local_4d0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_4d0._0_8_ = ((Alloc *)local_4d0._0_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_4d0._0_8_)->use_count = ((Alloc *)local_4d0._0_8_)->use_count + 1;
            }
          }
          local_4d0._8_8_ = (pAVar25->name)._M_dataplus._M_p;
          local_4d0._16_8_ = (pAVar25->name)._M_string_length;
          if ((local_4d0._16_8_ & 7) == 0 && (Alloc *)local_4d0._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_4d0._16_8_ = ((Alloc *)local_4d0._16_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_4d0._16_8_)->use_count = ((Alloc *)local_4d0._16_8_)->use_count + 1;
            }
          }
          local_4d0._24_8_ = (pAVar25->name).field_2._M_allocated_capacity;
          local_4b0 = *(element_type **)((long)&(pAVar25->name).field_2 + 8);
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4b0 = (element_type *)
                          ((long)(local_4b0->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_4a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar25->ptr;
          local_4a0 = *(element_type **)&pAVar25->use_count;
          if (((ulong)local_4a0 & 7) == 0 && local_4a0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4a0 = (element_type *)
                          ((long)(local_4a0->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4a0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4a0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_498._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar25->prev;
          local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_4d0._0_8_;
          if ((local_4d0._0_8_ & 7) == 0 && (Alloc *)local_4d0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_4d0._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_4d0._0_8_ + 0x30) = *(int *)(local_4d0._0_8_ + 0x30) + 1;
            }
          }
          local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_4d0._16_8_;
          if ((local_4d0._16_8_ & 7) == 0 && (Alloc *)local_4d0._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_4d0._16_8_ * 8 + 1);
            }
            else {
              *(int *)(local_4d0._16_8_ + 0x30) = *(int *)(local_4d0._16_8_ + 0x30) + 1;
            }
          }
          local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_4b0;
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_4b0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_4a0;
          if (((ulong)local_4a0 & 7) == 0 && local_4a0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_4a0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4a0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4a0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_160 = (local_a0->write_).shared_alloc_.alloc;
          if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_160 = (Alloc *)(local_160->size * 8 + 1);
            }
            else {
              local_160->use_count = local_160->use_count + 1;
            }
          }
          pAVar10 = local_160;
          local_4d8 = (Alloc *)(local_a0->write_).shared_alloc_.direct_ptr;
          local_170 = (((Write<double> *)&(local_358._M_pi)->_vptr__Sp_counted_base)->shared_alloc_)
                      .alloc;
          if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_170 = (Alloc *)(local_170->size * 8 + 1);
            }
            else {
              local_170->use_count = local_170->use_count + 1;
            }
          }
          pAVar19 = local_170;
          pAVar5 = *(Alloc **)&(local_358._M_pi)->_M_use_count;
          local_350 = (element_type *)local_560.shared_alloc_.alloc;
          if (((ulong)local_560.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_560.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_350 = (element_type *)
                          ((long)(((CommPtr *)&(local_560.shared_alloc_.alloc)->size)->
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_560.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.
                       alloc =
                   *(int *)&(((LOs *)&(local_560.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_348._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560.shared_alloc_.direct_ptr;
          if (((ulong)local_160 & 1) == 0) {
            sVar26 = local_160->size;
          }
          else {
            sVar26 = (ulong)local_160 >> 3;
          }
          local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr = (void *)local_4d0._8_8_;
          local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr = (void *)local_4d0._24_8_;
          local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr = local_4a8._M_pi;
          local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr = local_498._M_pi;
          local_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar5;
          local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8;
          LVar20 = Mesh::nelems(old_mesh);
          iVar21 = divide_no_remainder<int>((int)(sVar26 >> 3),LVar20);
          pvVar18 = local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
          local_618 = (Alloc *)CONCAT44(local_618._4_4_,iVar21);
          local_440 = (element_type *)local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_440 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_438._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
          local_430 = (element_type *)local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_430 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          peVar14 = local_430;
          local_628 = (Alloc *)local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
          local_428._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1e0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
          local_3d8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_3d8._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          _Var15._M_pi = local_3d8._M_pi;
          local_3d0 = (Alloc *)local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
          local_3c8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
          local_400 = (element_type *)local_1e0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
          local_410 = (Alloc *)local_1e0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_3c8._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          _Var17._M_pi = local_3c8._M_pi;
          local_3c0 = (Alloc *)local_1e0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
          local_4e8 = local_440;
          local_4e0 = pAVar5;
          local_420 = pAVar25;
          Mesh::ask_sizes((Mesh *)local_540);
          Mesh::ask_sizes((Mesh *)&local_470);
          bVar27 = ((ulong)_Var17._M_pi & 7) == 0;
          local_408._M_pi._0_1_ = bVar27 && (Alloc *)_Var17._M_pi != (Alloc *)0x0;
          local_580.write_.shared_alloc_.alloc = (Alloc *)_Var17._M_pi;
          if (bVar27 && (Alloc *)_Var17._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_580.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(_Var17._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&_Var17._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&_Var17._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_580.write_.shared_alloc_.direct_ptr = pvVar18;
          local_590.write_.shared_alloc_.alloc = pAVar10;
          if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_590.write_.shared_alloc_.alloc = (Alloc *)(pAVar10->size * 8 + 1);
            }
            else {
              pAVar10->use_count = pAVar10->use_count + 1;
            }
          }
          local_590.write_.shared_alloc_.direct_ptr = local_4d8;
          local_418._M_pi = _Var15._M_pi;
          unmap<double>((Omega_h *)local_3b0,&local_580,&local_590,(Int)local_618);
          read<double>((Omega_h *)&local_570,(Write<signed_char> *)local_3b0);
          pAVar25 = local_3b0[0];
          if (((ulong)local_3b0[0] & 7) == 0 && local_3b0[0] != (Alloc *)0x0) {
            piVar3 = &local_3b0[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_3b0[0]);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_590.write_.shared_alloc_.alloc;
          if (((ulong)local_590.write_.shared_alloc_.alloc & 7) == 0 &&
              local_590.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_590.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_590.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_580.write_.shared_alloc_.alloc;
          if (((ulong)local_580.write_.shared_alloc_.alloc & 7) == 0 &&
              local_580.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_580.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_580.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          bVar27 = ((ulong)peVar14 & 7) == 0;
          local_5a0.write_.shared_alloc_.alloc = (Alloc *)peVar14;
          if (bVar27 && peVar14 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5a0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(peVar14->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&peVar14->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&peVar14->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_5a0.write_.shared_alloc_.direct_ptr = local_628;
          local_500.write_.shared_alloc_.alloc = pAVar19;
          if (((ulong)pAVar19 & 7) == 0 && pAVar19 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_500.write_.shared_alloc_.alloc = (Alloc *)(pAVar19->size * 8 + 1);
            }
            else {
              pAVar19->use_count = pAVar19->use_count + 1;
            }
          }
          local_500.write_.shared_alloc_.direct_ptr = local_4e0;
          IVar22 = (Int)local_618;
          unmap<double>((Omega_h *)&local_3e8,&local_5a0,&local_500,(Int)local_618);
          read<double>((Omega_h *)&local_480,(Write<signed_char> *)&local_3e8);
          _Var15._M_pi = local_3e8._M_pi;
          if (((ulong)local_3e8._M_pi & 7) == 0 && (Alloc *)local_3e8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3e8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3e8._M_pi);
              operator_delete(_Var15._M_pi,0x48);
            }
          }
          pAVar25 = local_500.write_.shared_alloc_.alloc;
          if (((ulong)local_500.write_.shared_alloc_.alloc & 7) == 0 &&
              local_500.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_500.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_500.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_5a0.write_.shared_alloc_.alloc;
          if (((ulong)local_5a0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_5a0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_5a0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_5a0.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          peVar13 = local_400;
          peVar11 = local_4e8;
          local_520._0_8_ = _Var17._M_pi;
          if ((char)local_408._M_pi != '\0') {
            if (entering_parallel == '\x01') {
              local_520._0_8_ =
                   (element_type *)((long)(_Var17._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&_Var17._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&_Var17._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_520._8_8_ = pvVar18;
          local_5b0.write_.shared_alloc_.alloc = (Alloc *)local_540._0_8_;
          if ((local_540._0_8_ & 7) == 0 && (element_type *)local_540._0_8_ != (element_type *)0x0)
          {
            if (entering_parallel == '\x01') {
              local_5b0.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_540._0_8_ * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)(local_540._0_8_ + 0x30))->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)(local_540._0_8_ + 0x30))->write_).shared_alloc_.alloc + 1;
            }
          }
          local_5b0.write_.shared_alloc_.direct_ptr = (void *)local_540._8_8_;
          unmap<double>((Omega_h *)&local_450,(LOs *)local_520,&local_5b0,1);
          read<double>((Omega_h *)&local_510,(Write<signed_char> *)&local_450);
          pAVar25 = local_450.write_.shared_alloc_.alloc;
          if (((ulong)local_450.write_.shared_alloc_.alloc & 7) == 0 &&
              local_450.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_450.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_450.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_5b0.write_.shared_alloc_.alloc;
          if (((ulong)local_5b0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_5b0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_5b0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_5b0.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          uVar9 = local_520._0_8_;
          if ((local_520._0_8_ & 7) == 0 && (element_type *)local_520._0_8_ != (element_type *)0x0)
          {
            pLVar4 = (LOs *)(local_520._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_520._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          local_5c0.write_.shared_alloc_.alloc = (Alloc *)peVar14;
          if (bVar27 && peVar14 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5c0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(peVar14->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&peVar14->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&peVar14->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_5c0.write_.shared_alloc_.direct_ptr = local_628;
          local_5d0.write_.shared_alloc_.alloc = local_470;
          pAVar25 = (Alloc *)(local_648 + 0x10);
          if (((ulong)local_470 & 7) == 0 && local_470 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_5d0.write_.shared_alloc_.alloc = (Alloc *)(local_470->size * 8 + 1);
            }
            else {
              local_470->use_count = local_470->use_count + 1;
            }
          }
          local_5d0.write_.shared_alloc_.direct_ptr = local_468._M_pi;
          unmap<double>((Omega_h *)&local_3f8,&local_5c0,&local_5d0,1);
          read<double>((Omega_h *)&local_610,(Write<signed_char> *)&local_3f8);
          _Var15._M_pi = local_3f8._M_pi;
          if (((ulong)local_3f8._M_pi & 7) == 0 && (Alloc *)local_3f8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3f8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3f8._M_pi);
              operator_delete(_Var15._M_pi,0x48);
            }
          }
          pAVar10 = local_5d0.write_.shared_alloc_.alloc;
          if (((ulong)local_5d0.write_.shared_alloc_.alloc & 7) == 0 &&
              local_5d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_5d0.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_5d0.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          pAVar10 = local_5c0.write_.shared_alloc_.alloc;
          if (((ulong)local_5c0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_5c0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_5c0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_5c0.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          local_5f0._16_8_ = local_570;
          if (((ulong)local_570 & 7) == 0 && local_570 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_5f0._16_8_ = local_570->size * 8 + 1;
            }
            else {
              local_570->use_count = local_570->use_count + 1;
            }
          }
          local_5d8 = local_568;
          local_5f0._0_8_ = local_510.write_.shared_alloc_.alloc;
          if (((ulong)local_510.write_.shared_alloc_.alloc & 7) == 0 &&
              local_510.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_5f0._0_8_ = (local_510.write_.shared_alloc_.alloc)->size * 8 + 1;
            }
            else {
              (local_510.write_.shared_alloc_.alloc)->use_count =
                   (local_510.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_5f0._8_8_ = local_510.write_.shared_alloc_.direct_ptr;
          local_648._8_8_ = (void *)0x0;
          local_648._16_8_ = local_648._16_8_ & 0xffffffffffffff00;
          local_648._0_8_ = pAVar25;
          multiply_each<double>
                    ((Omega_h *)local_1f0,(Read<double> *)(local_5f0 + 0x10),
                     (Read<double> *)local_5f0,(string *)local_648);
          Read<double>::Read(&local_490,(Write<double> *)local_1f0);
          pAVar10 = local_1f0[0];
          if (((ulong)local_1f0[0] & 7) == 0 && local_1f0[0] != (Alloc *)0x0) {
            piVar3 = &local_1f0[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_1f0[0]);
              operator_delete(pAVar10,0x48);
            }
          }
          if ((Alloc *)local_648._0_8_ != pAVar25) {
            operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
          }
          uVar9 = local_5f0._0_8_;
          if ((local_5f0._0_8_ & 7) == 0 && (Alloc *)local_5f0._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_5f0._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_5f0._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          uVar9 = local_5f0._16_8_;
          if ((local_5f0._16_8_ & 7) == 0 && (Alloc *)local_5f0._16_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_5f0._16_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_5f0._16_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          local_200.write_.shared_alloc_.alloc = (Alloc *)local_480;
          if (((ulong)local_480 & 7) == 0 && local_480 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_200.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_480->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_480->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_480->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_200.write_.shared_alloc_.direct_ptr = local_478._M_pi;
          local_210.write_.shared_alloc_.alloc = local_610.write_.shared_alloc_.alloc;
          if (((ulong)local_610.write_.shared_alloc_.alloc & 7) == 0 &&
              local_610.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_210.write_.shared_alloc_.alloc =
                   (Alloc *)((local_610.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_610.write_.shared_alloc_.alloc)->use_count =
                   (local_610.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_210.write_.shared_alloc_.direct_ptr = local_610.write_.shared_alloc_.direct_ptr;
          local_648._8_8_ = (void *)0x0;
          local_648._16_8_ = local_648._16_8_ & 0xffffffffffffff00;
          local_648._0_8_ = pAVar25;
          multiply_each<double>((Omega_h *)&local_460,&local_200,&local_210,(string *)local_648);
          Read<double>::Read(&local_550,(Write<double> *)&local_460);
          pAVar10 = local_460.shared_alloc_.alloc;
          if (((ulong)local_460.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_460.shared_alloc_.alloc != (element_type *)0x0) {
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_460.shared_alloc_.alloc + 0x30);
            *(int *)&(((Write<int> *)&p_Var1->_vptr__Sp_counted_base)->shared_alloc_).alloc =
                 *(int *)&(((Write<int> *)&p_Var1->_vptr__Sp_counted_base)->shared_alloc_).alloc +
                 -1;
            if (*(int *)&(((Write<int> *)&p_Var1->_vptr__Sp_counted_base)->shared_alloc_).alloc == 0
               ) {
              Alloc::~Alloc(local_460.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          if ((Alloc *)local_648._0_8_ != pAVar25) {
            operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
          }
          pAVar10 = local_210.write_.shared_alloc_.alloc;
          if (((ulong)local_210.write_.shared_alloc_.alloc & 7) == 0 &&
              local_210.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_210.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_210.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          pAVar10 = local_200.write_.shared_alloc_.alloc;
          if (((ulong)local_200.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_200.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_200.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_200.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          local_220.write_.shared_alloc_.alloc = (Alloc *)local_418._M_pi;
          if (((ulong)local_418._M_pi & 7) == 0 && (Alloc *)local_418._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_220.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_418._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&local_418._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_418._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_220.write_.shared_alloc_.direct_ptr = local_410;
          local_230.write_.shared_alloc_.alloc = local_490.write_.shared_alloc_.alloc;
          if (((ulong)local_490.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_490.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_230.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_490.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_230.write_.shared_alloc_.direct_ptr = local_490.write_.shared_alloc_.direct_ptr;
          fan_reduce<double>((Omega_h *)&local_b0,&local_220,&local_230,IVar22,OMEGA_H_SUM);
          pAVar10 = local_230.write_.shared_alloc_.alloc;
          if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_230.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_230.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          pAVar10 = local_220.write_.shared_alloc_.alloc;
          if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
              local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_220.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_220.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          local_240.write_.shared_alloc_.alloc = (Alloc *)peVar11;
          bVar27 = ((ulong)peVar11 & 7) == 0;
          if (bVar27 && peVar11 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_240.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(peVar11->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&peVar11->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&peVar11->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_240.write_.shared_alloc_.direct_ptr = peVar13;
          local_250.write_.shared_alloc_.alloc = local_550.write_.shared_alloc_.alloc;
          if (((ulong)local_550.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_550.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_250.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_550.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_550.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_550.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_250.write_.shared_alloc_.direct_ptr = local_550.write_.shared_alloc_.direct_ptr;
          fan_reduce<double>((Omega_h *)&local_c0,&local_240,&local_250,IVar22,OMEGA_H_SUM);
          pAVar10 = local_250.write_.shared_alloc_.alloc;
          if (((ulong)local_250.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_250.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_250.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_250.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          pAVar10 = local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_240.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_240.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_240.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          local_260.write_.shared_alloc_.alloc = (Alloc *)local_c0;
          if (((ulong)local_c0 & 7) == 0 && local_c0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_260.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_c0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_c0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_c0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_260.write_.shared_alloc_.direct_ptr = local_b8;
          local_270.write_.shared_alloc_.alloc = local_b0;
          if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_270.write_.shared_alloc_.alloc = (Alloc *)(local_b0->size * 8 + 1);
            }
            else {
              local_b0->use_count = local_b0->use_count + 1;
            }
          }
          local_270.write_.shared_alloc_.direct_ptr = local_a8;
          subtract_each<double>((Omega_h *)local_d0,&local_260,&local_270);
          pAVar10 = local_270.write_.shared_alloc_.alloc;
          if (((ulong)local_270.write_.shared_alloc_.alloc & 7) == 0 &&
              local_270.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_270.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_270.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          pAVar10 = local_260.write_.shared_alloc_.alloc;
          if (((ulong)local_260.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_260.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_260.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_260.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          local_280.write_.shared_alloc_.alloc = (Alloc *)peVar11;
          if (bVar27 && peVar11 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_280.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(peVar11->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&peVar11->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&peVar11->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_280.write_.shared_alloc_.direct_ptr = peVar13;
          local_290.write_.shared_alloc_.alloc = local_610.write_.shared_alloc_.alloc;
          if (((ulong)local_610.write_.shared_alloc_.alloc & 7) == 0 &&
              local_610.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_290.write_.shared_alloc_.alloc =
                   (Alloc *)((local_610.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_610.write_.shared_alloc_.alloc)->use_count =
                   (local_610.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_290.write_.shared_alloc_.direct_ptr = local_610.write_.shared_alloc_.direct_ptr;
          fan_reduce<double>((Omega_h *)&local_e0,&local_280,&local_290,1,OMEGA_H_SUM);
          pAVar10 = local_290.write_.shared_alloc_.alloc;
          if (((ulong)local_290.write_.shared_alloc_.alloc & 7) == 0 &&
              local_290.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_290.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_290.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          pAVar10 = local_280.write_.shared_alloc_.alloc;
          if (((ulong)local_280.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_280.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_280.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_280.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          local_2a0.write_.shared_alloc_.alloc = (Alloc *)local_d0._0_8_;
          if ((local_d0._0_8_ & 7) == 0 && (Library *)local_d0._0_8_ != (Library *)0x0) {
            if (entering_parallel == '\x01') {
              local_2a0.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_d0._0_8_ * 8 + 1);
            }
            else {
              *(int *)&(((CommPtr *)(local_d0._0_8_ + 0x30))->
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   *(int *)&(((CommPtr *)(local_d0._0_8_ + 0x30))->
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   1;
            }
          }
          local_2a0.write_.shared_alloc_.direct_ptr = (void *)local_d0._8_8_;
          local_2b0.write_.shared_alloc_.alloc = local_e0;
          if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2b0.write_.shared_alloc_.alloc = (Alloc *)(local_e0->size * 8 + 1);
            }
            else {
              local_e0->use_count = local_e0->use_count + 1;
            }
          }
          local_2b0.write_.shared_alloc_.direct_ptr = local_d8._M_pi;
          divide_each_maybe_zero((Omega_h *)local_f0,&local_2a0,&local_2b0);
          pAVar10 = local_2b0.write_.shared_alloc_.alloc;
          if (((ulong)local_2b0.write_.shared_alloc_.alloc & 7) == 0 &&
              local_2b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_2b0.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_2b0.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          pAVar10 = local_2a0.write_.shared_alloc_.alloc;
          if (((ulong)local_2a0.write_.shared_alloc_.alloc & 7) == 0 &&
              (Library *)local_2a0.write_.shared_alloc_.alloc != (Library *)0x0) {
            pCVar2 = (CommPtr *)&(local_2a0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 = *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + -1;
            if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr == 0) {
              Alloc::~Alloc(local_2a0.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          peVar14 = local_440;
          local_2c0.write_.shared_alloc_.alloc = (Alloc *)local_f0._0_8_;
          if ((local_f0._0_8_ & 7) == 0 && (Alloc *)local_f0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2c0.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_f0._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_f0._0_8_ + 0x30) = *(int *)(local_f0._0_8_ + 0x30) + 1;
            }
          }
          local_2c0.write_.shared_alloc_.direct_ptr = (void *)local_f0._8_8_;
          local_2d0.write_.shared_alloc_.alloc = (Alloc *)local_440;
          bVar27 = local_440 != (element_type *)0x0;
          bVar28 = ((ulong)local_440 & 7) == 0;
          if (bVar28 && bVar27) {
            if (entering_parallel == '\x01') {
              local_2d0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_440->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_440->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_440->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_2d0.write_.shared_alloc_.direct_ptr = local_438._M_pi;
          expand<double>((Omega_h *)local_100,&local_2c0,&local_2d0,IVar22);
          pAVar10 = local_2d0.write_.shared_alloc_.alloc;
          if (((ulong)local_2d0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_2d0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_2d0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_2d0.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          pAVar10 = local_2c0.write_.shared_alloc_.alloc;
          if (((ulong)local_2c0.write_.shared_alloc_.alloc & 7) == 0 &&
              local_2c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_2c0.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_2c0.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
            }
          }
          local_2f0._16_8_ = local_100._0_8_;
          if ((local_100._0_8_ & 7) == 0 && (Alloc *)local_100._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2f0._16_8_ = *(size_t *)local_100._0_8_ * 8 + 1;
            }
            else {
              *(int *)(local_100._0_8_ + 0x30) = *(int *)(local_100._0_8_ + 0x30) + 1;
            }
          }
          local_2d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
          local_2f0._0_8_ = local_610.write_.shared_alloc_.alloc;
          if (((ulong)local_610.write_.shared_alloc_.alloc & 7) == 0 &&
              local_610.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2f0._0_8_ = (local_610.write_.shared_alloc_.alloc)->size * 8 + 1;
            }
            else {
              (local_610.write_.shared_alloc_.alloc)->use_count =
                   (local_610.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_2f0._8_8_ = local_610.write_.shared_alloc_.direct_ptr;
          local_648._8_8_ = (void *)0x0;
          local_648._16_8_ = local_648._16_8_ & 0xffffffffffffff00;
          local_648._0_8_ = pAVar25;
          multiply_each<double>
                    ((Omega_h *)local_40,(Read<double> *)(local_2f0 + 0x10),
                     (Read<double> *)local_2f0,(string *)local_648);
          Read<double>::Read(&local_110,(Write<double> *)local_40);
          pAVar10 = local_40[0];
          if (((ulong)local_40[0] & 7) == 0 && local_40[0] != (Alloc *)0x0) {
            piVar3 = &local_40[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_40[0]);
              operator_delete(pAVar10,0x48);
            }
          }
          if ((Alloc *)local_648._0_8_ != pAVar25) {
            operator_delete((void *)local_648._0_8_,(ulong)(local_648._16_8_ + 1));
          }
          uVar9 = local_2f0._0_8_;
          if ((local_2f0._0_8_ & 7) == 0 && (Alloc *)local_2f0._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_2f0._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_2f0._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          uVar9 = local_2f0._16_8_;
          if ((local_2f0._16_8_ & 7) == 0 && (Alloc *)local_2f0._16_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_2f0._16_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_2f0._16_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          peVar13 = local_350;
          peVar11 = local_430;
          local_648._0_8_ = local_110.write_.shared_alloc_.alloc;
          if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
              local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_648._0_8_ = (local_110.write_.shared_alloc_.alloc)->size * 8 + 1;
            }
            else {
              (local_110.write_.shared_alloc_.alloc)->use_count =
                   (local_110.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_628 = (Alloc *)CONCAT71(local_628._1_7_,bVar28 && bVar27);
          local_648._8_8_ = local_110.write_.shared_alloc_.direct_ptr;
          local_300.write_.shared_alloc_.alloc = (Alloc *)local_430;
          bVar27 = local_430 != (element_type *)0x0;
          bVar28 = ((ulong)local_430 & 7) == 0;
          if (bVar28 && bVar27) {
            if (entering_parallel == '\x01') {
              local_300.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_430->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_430->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_430->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_300.write_.shared_alloc_.direct_ptr = local_428._M_pi;
          local_310.shared_alloc_.alloc = (Alloc *)local_350;
          bVar29 = local_350 != (element_type *)0x0;
          bVar30 = ((ulong)local_350 & 7) == 0;
          if (bVar30 && bVar29) {
            if (entering_parallel == '\x01') {
              local_310.shared_alloc_.alloc =
                   (Alloc *)((long)(local_350->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_350->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_350->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_310.shared_alloc_.direct_ptr = local_348._M_pi;
          add_into<double>((Read<signed_char> *)local_648,&local_300,&local_310,IVar22);
          pAVar25 = local_310.shared_alloc_.alloc;
          if (((ulong)local_310.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_310.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_310.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_310.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_300.write_.shared_alloc_.alloc;
          if (((ulong)local_300.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_300.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_300.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_300.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          uVar9 = local_648._0_8_;
          if ((local_648._0_8_ & 7) == 0 && (Alloc *)local_648._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_648._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_648._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          pAVar25 = local_110.write_.shared_alloc_.alloc;
          if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
              local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_110.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_110.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          uVar9 = local_100._0_8_;
          if ((local_100._0_8_ & 7) == 0 && (Alloc *)local_100._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_100._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_100._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          uVar9 = local_f0._0_8_;
          if ((local_f0._0_8_ & 7) == 0 && (Alloc *)local_f0._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_f0._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_f0._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          pAVar25 = local_e0;
          if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
            piVar3 = &local_e0->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_e0);
              operator_delete(pAVar25,0x48);
            }
          }
          uVar9 = local_d0._0_8_;
          if ((local_d0._0_8_ & 7) == 0 && (Library *)local_d0._0_8_ != (Library *)0x0) {
            pCVar2 = (CommPtr *)(local_d0._0_8_ + 0x30);
            *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 = *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + -1;
            if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr == 0) {
              Alloc::~Alloc((Alloc *)local_d0._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          peVar12 = local_c0;
          if (((ulong)local_c0 & 7) == 0 && local_c0 != (element_type *)0x0) {
            pLVar4 = local_c0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_c0);
              operator_delete(peVar12,0x48);
            }
          }
          pAVar25 = local_b0;
          if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
            piVar3 = &local_b0->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_b0);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_550.write_.shared_alloc_.alloc;
          if (((ulong)local_550.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_550.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_550.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_550.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_490.write_.shared_alloc_.alloc;
          if (((ulong)local_490.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_490.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_490.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_610.write_.shared_alloc_.alloc;
          if (((ulong)local_610.write_.shared_alloc_.alloc & 7) == 0 &&
              local_610.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_610.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_610.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_510.write_.shared_alloc_.alloc;
          if (((ulong)local_510.write_.shared_alloc_.alloc & 7) == 0 &&
              local_510.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_510.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_510.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          peVar12 = local_480;
          if (((ulong)local_480 & 7) == 0 && local_480 != (element_type *)0x0) {
            pLVar4 = local_480->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_480);
              operator_delete(peVar12,0x48);
            }
          }
          pAVar25 = local_570;
          if (((ulong)local_570 & 7) == 0 && local_570 != (Alloc *)0x0) {
            piVar3 = &local_570->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_570);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_470;
          if (((ulong)local_470 & 7) == 0 && local_470 != (Alloc *)0x0) {
            piVar3 = &local_470->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_470);
              operator_delete(pAVar25,0x48);
            }
          }
          uVar9 = local_540._0_8_;
          if ((local_540._0_8_ & 7) == 0 && (element_type *)local_540._0_8_ != (element_type *)0x0)
          {
            pLVar4 = (LOs *)(local_540._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_540._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          _Var15._M_pi = local_3c8._M_pi;
          if (((ulong)local_3c8._M_pi & 7) == 0 && (Alloc *)local_3c8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3c8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3c8._M_pi);
              operator_delete(_Var15._M_pi,0x48);
            }
          }
          _Var15._M_pi = local_3d8._M_pi;
          if (((ulong)local_3d8._M_pi & 7) == 0 && (Alloc *)local_3d8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3d8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3d8._M_pi);
              operator_delete(_Var15._M_pi,0x48);
            }
          }
          if (bVar28 && bVar27) {
            pLVar4 = peVar11->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)peVar11);
              operator_delete(peVar11,0x48);
            }
          }
          if ((char)local_628 != '\0') {
            pLVar4 = peVar14->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)peVar14);
              operator_delete(peVar14,0x48);
            }
          }
          if (bVar30 && bVar29) {
            pLVar4 = peVar13->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)peVar13);
              operator_delete(peVar13,0x48);
            }
          }
          pAVar25 = local_170;
          old_mesh = local_600;
          if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
            piVar3 = &local_170->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_170);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar10 = local_160;
          pAVar25 = local_420;
          if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
            piVar3 = &local_160->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_160);
              operator_delete(pAVar10,0x48);
            }
          }
          Cavs::~Cavs(&local_1e0);
          Cavs::~Cavs((Cavs *)local_4d0);
          pAVar25 = (Alloc *)&pAVar25->next;
        } while (pAVar25 != local_98);
      }
    }
    if (conserved_bools.always._M_elems
        [(long)&(local_4f0->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr] == false) {
      pAVar25 = *(Alloc **)((long)local_368._M_pi + (long)local_4f0 * 0x48 + 0x18);
      local_420 = *(Alloc **)((long)local_368._M_pi + (long)local_4f0 * 0x48 + 0x20);
      if (pAVar25 != local_420) {
        do {
          local_4d0._0_8_ = pAVar25->size;
          if ((local_4d0._0_8_ & 7) == 0 && (Alloc *)local_4d0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_4d0._0_8_ = ((Alloc *)local_4d0._0_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_4d0._0_8_)->use_count = ((Alloc *)local_4d0._0_8_)->use_count + 1;
            }
          }
          local_618 = (Alloc *)(pAVar25->name)._M_dataplus._M_p;
          local_4d0._16_8_ = (pAVar25->name)._M_string_length;
          if ((local_4d0._16_8_ & 7) == 0 && (Alloc *)local_4d0._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_4d0._16_8_ = ((Alloc *)local_4d0._16_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_4d0._16_8_)->use_count = ((Alloc *)local_4d0._16_8_)->use_count + 1;
            }
          }
          local_628 = (Alloc *)(pAVar25->name).field_2._M_allocated_capacity;
          local_4b0 = *(element_type **)((long)&(pAVar25->name).field_2 + 8);
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4b0 = (element_type *)
                          ((long)(local_4b0->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_4a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar25->ptr;
          local_4a0 = *(element_type **)&pAVar25->use_count;
          if (((ulong)local_4a0 & 7) == 0 && local_4a0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4a0 = (element_type *)
                          ((long)(local_4a0->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4a0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4a0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_498._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar25->prev;
          local_80.keys2old_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_4d0._0_8_;
          if ((local_4d0._0_8_ & 7) == 0 && (Alloc *)local_4d0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_80.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_4d0._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_4d0._0_8_ + 0x30) = *(int *)(local_4d0._0_8_ + 0x30) + 1;
            }
          }
          local_80.keys2old_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_4d0._16_8_;
          if ((local_4d0._16_8_ & 7) == 0 && (Alloc *)local_4d0._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_80.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_4d0._16_8_ * 8 + 1);
            }
            else {
              *(int *)(local_4d0._16_8_ + 0x30) = *(int *)(local_4d0._16_8_ + 0x30) + 1;
            }
          }
          local_80.keys2new_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_4b0;
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_80.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_4b0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_80.keys2new_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_4a0;
          if (((ulong)local_4a0 & 7) == 0 && local_4a0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_80.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_4a0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4a0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4a0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_180 = (element_type *)local_560.shared_alloc_.alloc;
          if (((ulong)local_560.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_560.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_180 = (element_type *)
                          ((long)(((CommPtr *)&(local_560.shared_alloc_.alloc)->size)->
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_560.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.
                       alloc =
                   *(int *)&(((LOs *)&(local_560.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_178._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560.shared_alloc_.direct_ptr;
          ent_dim = old_mesh->dim_;
          local_4d0._8_8_ = local_618;
          local_4d0._24_8_ = local_628;
          local_80.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr = local_618;
          local_80.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr = local_628;
          local_80.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr = local_4a8._M_pi;
          local_80.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr = local_498._M_pi;
          if (3 < ent_dim) {
            fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                 ,0x33);
          }
          local_408._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560.shared_alloc_.direct_ptr;
          local_440 = (element_type *)local_80.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_80.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_80.keys2old_elems.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_440 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_80.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_80.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_80.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          peVar14 = local_440;
          local_430 = (element_type *)local_80.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_80.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_80.keys2old_elems.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_430 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_80.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_80.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_80.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          peVar11 = local_430;
          local_3d8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_80.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_80.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_80.keys2new_elems.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_3d8._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)(((CommPtr *)
                           &(local_80.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size)->
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8
                   + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_80.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_80.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          _Var15._M_pi = local_3d8._M_pi;
          local_3c8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_80.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_80.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_80.keys2new_elems.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_3c8._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)(((CommPtr *)
                           &(local_80.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size)->
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8
                   + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_80.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_80.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          _Var17._M_pi = local_3c8._M_pi;
          local_4e0 = (Alloc *)local_4a8._M_pi;
          local_4d8 = (Alloc *)local_498._M_pi;
          local_438._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618;
          local_428._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_628;
          local_410 = pAVar25;
          local_400 = local_180;
          local_3d0 = (Alloc *)local_4a8._M_pi;
          local_3c0 = (Alloc *)local_498._M_pi;
          Mesh::ask_sizes((Mesh *)&local_470);
          bVar27 = ((ulong)_Var17._M_pi & 7) == 0;
          local_4e8 = (element_type *)
                      CONCAT71(local_4e8._1_7_,bVar27 && (Alloc *)_Var17._M_pi != (Alloc *)0x0);
          local_580.write_.shared_alloc_.alloc = (Alloc *)_Var17._M_pi;
          if (bVar27 && (Alloc *)_Var17._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_580.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(_Var17._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&_Var17._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&_Var17._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_580.write_.shared_alloc_.direct_ptr = local_4d8;
          local_590.write_.shared_alloc_.alloc = local_470;
          if (((ulong)local_470 & 7) == 0 && local_470 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_590.write_.shared_alloc_.alloc = (Alloc *)(local_470->size * 8 + 1);
            }
            else {
              local_470->use_count = local_470->use_count + 1;
            }
          }
          local_590.write_.shared_alloc_.direct_ptr = local_468._M_pi;
          unmap<double>((Omega_h *)local_3b0,&local_580,&local_590,1);
          read<double>((Omega_h *)&local_570,(Write<signed_char> *)local_3b0);
          pAVar25 = local_3b0[0];
          if (((ulong)local_3b0[0] & 7) == 0 && local_3b0[0] != (Alloc *)0x0) {
            piVar3 = &local_3b0[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_3b0[0]);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_590.write_.shared_alloc_.alloc;
          if (((ulong)local_590.write_.shared_alloc_.alloc & 7) == 0 &&
              local_590.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_590.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_590.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_580.write_.shared_alloc_.alloc;
          if (((ulong)local_580.write_.shared_alloc_.alloc & 7) == 0 &&
              local_580.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_580.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_580.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pTVar23 = Mesh::get_tag<double>(local_600,ent_dim,(string *)local_360);
          IVar22 = TagBase::ncomps(&pTVar23->super_TagBase);
          Tag<double>::array(pTVar23);
          bVar27 = ((ulong)peVar14 & 7) == 0;
          local_648._0_8_ = peVar14;
          if (bVar27 && peVar14 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_648._0_8_ =
                   (Alloc *)((long)(peVar14->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&peVar14->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&peVar14->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_648._8_8_ = local_618;
          bVar28 = ((ulong)peVar11 & 7) == 0;
          local_418._M_pi._0_1_ = bVar28 && peVar11 != (element_type *)0x0;
          local_648._16_8_ = peVar11;
          if (bVar28 && peVar11 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_648._16_8_ =
                   (Alloc *)((long)(peVar11->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&peVar11->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&peVar11->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_648._24_8_ = local_628;
          local_5a0.write_.shared_alloc_.alloc = (Alloc *)local_480;
          if (((ulong)local_480 & 7) == 0 && local_480 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5a0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_480->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_480->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_480->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_5a0.write_.shared_alloc_.direct_ptr = local_478._M_pi;
          graph_reduce<double>
                    ((Omega_h *)&local_3e8,(Graph *)local_648,(Read<double> *)&local_5a0,IVar22,
                     OMEGA_H_SUM);
          pAVar25 = local_5a0.write_.shared_alloc_.alloc;
          local_628 = (Alloc *)CONCAT71(local_628._1_7_,bVar27 && peVar14 != (element_type *)0x0);
          if (((ulong)local_5a0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_5a0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_5a0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_5a0.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          uVar9 = local_648._16_8_;
          if ((local_648._16_8_ & 7) == 0 && (Alloc *)local_648._16_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_648._16_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_648._16_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          uVar9 = local_648._0_8_;
          if ((local_648._0_8_ & 7) == 0 && (Alloc *)local_648._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_648._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_648._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          bVar27 = ((ulong)_Var15._M_pi & 7) == 0;
          local_618 = (Alloc *)CONCAT71(local_618._1_7_,
                                        bVar27 && (Alloc *)_Var15._M_pi != (Alloc *)0x0);
          local_510.write_.shared_alloc_.alloc = (Alloc *)_Var15._M_pi;
          if (bVar27 && (Alloc *)_Var15._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_510.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(_Var15._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&_Var15._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&_Var15._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_510.write_.shared_alloc_.direct_ptr = local_4e0;
          local_450.write_.shared_alloc_.alloc = local_570;
          if (((ulong)local_570 & 7) == 0 && local_570 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_450.write_.shared_alloc_.alloc = (Alloc *)(local_570->size * 8 + 1);
            }
            else {
              local_570->use_count = local_570->use_count + 1;
            }
          }
          local_450.write_.shared_alloc_.direct_ptr = local_568;
          fan_reduce<double>((Omega_h *)&local_500,&local_510,&local_450,1,OMEGA_H_SUM);
          pAVar25 = local_450.write_.shared_alloc_.alloc;
          if (((ulong)local_450.write_.shared_alloc_.alloc & 7) == 0 &&
              local_450.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_450.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_450.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_510.write_.shared_alloc_.alloc;
          if (((ulong)local_510.write_.shared_alloc_.alloc & 7) == 0 &&
              local_510.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_510.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_510.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          local_5b0.write_.shared_alloc_.alloc = (Alloc *)local_3e8._M_pi;
          if (((ulong)local_3e8._M_pi & 7) == 0 && (Alloc *)local_3e8._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_5b0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_3e8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&local_3e8._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_3e8._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_5b0.write_.shared_alloc_.direct_ptr = local_3e0;
          local_610.write_.shared_alloc_.alloc = local_500.write_.shared_alloc_.alloc;
          if (((ulong)local_500.write_.shared_alloc_.alloc & 7) == 0 &&
              local_500.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_610.write_.shared_alloc_.alloc =
                   (Alloc *)((local_500.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_500.write_.shared_alloc_.alloc)->use_count =
                   (local_500.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_610.write_.shared_alloc_.direct_ptr = local_500.write_.shared_alloc_.direct_ptr;
          divide_each_maybe_zero((Omega_h *)local_520,(Reals *)&local_5b0,&local_610);
          pAVar25 = local_610.write_.shared_alloc_.alloc;
          if (((ulong)local_610.write_.shared_alloc_.alloc & 7) == 0 &&
              local_610.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_610.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_610.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_5b0.write_.shared_alloc_.alloc;
          if (((ulong)local_5b0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_5b0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_5b0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_5b0.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          local_5c0.write_.shared_alloc_.alloc = (Alloc *)local_520._0_8_;
          if ((local_520._0_8_ & 7) == 0 && (element_type *)local_520._0_8_ != (element_type *)0x0)
          {
            if (entering_parallel == '\x01') {
              local_5c0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)local_520._0_8_)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)(local_520._0_8_ + 0x30))->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)(local_520._0_8_ + 0x30))->write_).shared_alloc_.alloc + 1;
            }
          }
          local_5c0.write_.shared_alloc_.direct_ptr = (void *)local_520._8_8_;
          local_5d0.write_.shared_alloc_.alloc = (Alloc *)_Var15._M_pi;
          if ((char)local_618 != '\0') {
            if (entering_parallel == '\x01') {
              local_5d0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(_Var15._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&_Var15._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&_Var15._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_5d0.write_.shared_alloc_.direct_ptr = local_4e0;
          expand<double>((Omega_h *)&local_3f8,(Read<signed_char> *)&local_5c0,(LOs *)&local_5d0,
                         IVar22);
          pAVar25 = local_5d0.write_.shared_alloc_.alloc;
          if (((ulong)local_5d0.write_.shared_alloc_.alloc & 7) == 0 &&
              local_5d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_5d0.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_5d0.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_5c0.write_.shared_alloc_.alloc;
          if (((ulong)local_5c0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_5c0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_5c0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_5c0.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          local_5f0._16_8_ = local_3f8._M_pi;
          if (((ulong)local_3f8._M_pi & 7) == 0 && (Alloc *)local_3f8._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_5f0._16_8_ = (long)(local_3f8._M_pi)->_vptr__Sp_counted_base * 8 + 1;
            }
            else {
              *(int *)&local_3f8._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_3f8._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_5d8 = local_3f0;
          local_5f0._0_8_ = local_570;
          if (((ulong)local_570 & 7) == 0 && local_570 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_5f0._0_8_ = local_570->size * 8 + 1;
            }
            else {
              local_570->use_count = local_570->use_count + 1;
            }
          }
          local_5f0._8_8_ = local_568;
          local_540._0_8_ = local_540 + 0x10;
          local_540._8_8_ = (element_type *)0x0;
          local_540[0x10] = '\0';
          multiply_each<double>
                    ((Omega_h *)local_1f0,(Read<double> *)(local_5f0 + 0x10),
                     (Read<double> *)local_5f0,(string *)local_540);
          Read<double>::Read(&local_490,(Write<double> *)local_1f0);
          pAVar25 = local_1f0[0];
          if (((ulong)local_1f0[0] & 7) == 0 && local_1f0[0] != (Alloc *)0x0) {
            piVar3 = &local_1f0[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_1f0[0]);
              operator_delete(pAVar25,0x48);
            }
          }
          if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
            operator_delete((void *)local_540._0_8_,CONCAT71(local_540._17_7_,local_540[0x10]) + 1);
          }
          uVar9 = local_5f0._0_8_;
          if ((local_5f0._0_8_ & 7) == 0 && (Alloc *)local_5f0._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_5f0._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_5f0._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          uVar9 = local_5f0._16_8_;
          if ((local_5f0._16_8_ & 7) == 0 && (Alloc *)local_5f0._16_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_5f0._16_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_5f0._16_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          local_540._0_8_ = local_490.write_.shared_alloc_.alloc;
          if (((ulong)local_490.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_490.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_540._0_8_ =
                   (long)(((CommPtr *)&(local_490.write_.shared_alloc_.alloc)->size)->
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8 +
                   1;
            }
            else {
              *(int *)&(((LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_540._8_8_ = local_490.write_.shared_alloc_.direct_ptr;
          local_550.write_.shared_alloc_.alloc = (Alloc *)_Var17._M_pi;
          if ((char)local_4e8 != '\0') {
            if (entering_parallel == '\x01') {
              local_550.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(_Var17._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&_Var17._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&_Var17._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_550.write_.shared_alloc_.direct_ptr = local_4d8;
          local_460.shared_alloc_.alloc = (Alloc *)local_400;
          if (((ulong)local_400 & 7) == 0 && local_400 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_460.shared_alloc_.alloc =
                   (Alloc *)((long)(local_400->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_400->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_400->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_460.shared_alloc_.direct_ptr = local_408._M_pi;
          add_into<double>((Read<signed_char> *)local_540,(LOs *)&local_550,&local_460,IVar22);
          pAVar25 = local_460.shared_alloc_.alloc;
          if (((ulong)local_460.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_460.shared_alloc_.alloc != (element_type *)0x0) {
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_460.shared_alloc_.alloc + 0x30);
            *(int *)&(((Write<int> *)&p_Var1->_vptr__Sp_counted_base)->shared_alloc_).alloc =
                 *(int *)&(((Write<int> *)&p_Var1->_vptr__Sp_counted_base)->shared_alloc_).alloc +
                 -1;
            if (*(int *)&(((Write<int> *)&p_Var1->_vptr__Sp_counted_base)->shared_alloc_).alloc == 0
               ) {
              Alloc::~Alloc(local_460.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_550.write_.shared_alloc_.alloc;
          if (((ulong)local_550.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_550.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_550.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_550.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          uVar9 = local_540._0_8_;
          if ((local_540._0_8_ & 7) == 0 && (element_type *)local_540._0_8_ != (element_type *)0x0)
          {
            pLVar4 = (LOs *)(local_540._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_540._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          pAVar25 = local_490.write_.shared_alloc_.alloc;
          if (((ulong)local_490.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_490.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_490.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          _Var16._M_pi = local_3f8._M_pi;
          if (((ulong)local_3f8._M_pi & 7) == 0 && (Alloc *)local_3f8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3f8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3f8._M_pi);
              operator_delete(_Var16._M_pi,0x48);
            }
          }
          uVar9 = local_520._0_8_;
          if ((local_520._0_8_ & 7) == 0 && (element_type *)local_520._0_8_ != (element_type *)0x0)
          {
            pLVar4 = (LOs *)(local_520._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_520._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          pAVar25 = local_500.write_.shared_alloc_.alloc;
          if (((ulong)local_500.write_.shared_alloc_.alloc & 7) == 0 &&
              local_500.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_500.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_500.write_.shared_alloc_.alloc);
              operator_delete(pAVar25,0x48);
            }
          }
          _Var16._M_pi = local_3e8._M_pi;
          if (((ulong)local_3e8._M_pi & 7) == 0 && (Alloc *)local_3e8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3e8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3e8._M_pi);
              operator_delete(_Var16._M_pi,0x48);
            }
          }
          peVar13 = local_480;
          if (((ulong)local_480 & 7) == 0 && local_480 != (element_type *)0x0) {
            pLVar4 = local_480->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_480);
              operator_delete(peVar13,0x48);
            }
          }
          pAVar25 = local_570;
          if (((ulong)local_570 & 7) == 0 && local_570 != (Alloc *)0x0) {
            piVar3 = &local_570->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_570);
              operator_delete(pAVar25,0x48);
            }
          }
          pAVar25 = local_470;
          if (((ulong)local_470 & 7) == 0 && local_470 != (Alloc *)0x0) {
            piVar3 = &local_470->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_470);
              operator_delete(pAVar25,0x48);
            }
          }
          if ((char)local_4e8 != '\0') {
            p_Var1 = _Var17._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)_Var17._M_pi);
              operator_delete(_Var17._M_pi,0x48);
            }
          }
          old_mesh = local_600;
          if ((char)local_618 != '\0') {
            p_Var1 = _Var15._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)_Var15._M_pi);
              operator_delete(_Var15._M_pi,0x48);
            }
          }
          if ((char)local_418._M_pi != '\0') {
            pLVar4 = peVar11->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)peVar11);
              operator_delete(peVar11,0x48);
            }
          }
          if ((char)local_628 != '\0') {
            pLVar4 = peVar14->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)peVar14);
              operator_delete(peVar14,0x48);
            }
          }
          peVar14 = local_180;
          if (((ulong)local_180 & 7) == 0 && local_180 != (element_type *)0x0) {
            pLVar4 = local_180->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_180);
              operator_delete(peVar14,0x48);
            }
          }
          Cavs::~Cavs(&local_80);
          Cavs::~Cavs((Cavs *)local_4d0);
          pAVar25 = (Alloc *)&local_410->next;
        } while (pAVar25 != local_420);
      }
    }
    psVar24 = (pointer)((long)&(local_4f0->
                               super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + 1);
    if (psVar24 == (pointer)0x3) {
      local_190.shared_alloc_.alloc = local_560.shared_alloc_.alloc;
      if (((ulong)local_560.shared_alloc_.alloc & 7) == 0 &&
          (element_type *)local_560.shared_alloc_.alloc != (element_type *)0x0) {
        if (entering_parallel == '\x01') {
          local_190.shared_alloc_.alloc =
               (Alloc *)((long)(((CommPtr *)&(local_560.shared_alloc_.alloc)->size)->
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         * 8 + 1);
        }
        else {
          *(int *)&(((LOs *)&(local_560.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.
                   alloc =
               *(int *)&(((LOs *)&(local_560.shared_alloc_.alloc)->use_count)->write_).shared_alloc_
                        .alloc + 1;
        }
      }
      local_190.shared_alloc_.direct_ptr = local_560.shared_alloc_.direct_ptr;
      Read<double>::Read((Read<signed_char> *)local_4d0,&local_190);
      pAVar25 = local_190.shared_alloc_.alloc;
      if (((ulong)local_190.shared_alloc_.alloc & 7) == 0 &&
          (element_type *)local_190.shared_alloc_.alloc != (element_type *)0x0) {
        pLVar4 = (LOs *)&(local_190.shared_alloc_.alloc)->use_count;
        *(int *)&(pLVar4->write_).shared_alloc_.alloc =
             *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
        if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
          Alloc::~Alloc(local_190.shared_alloc_.alloc);
          operator_delete(pAVar25,0x48);
        }
      }
      pAVar25 = local_360;
      local_1a0.write_.shared_alloc_.alloc = (Alloc *)local_4d0._0_8_;
      if ((local_4d0._0_8_ & 7) == 0 && (Alloc *)local_4d0._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1a0.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_4d0._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_4d0._0_8_ + 0x30) = *(int *)(local_4d0._0_8_ + 0x30) + 1;
        }
      }
      local_1a0.write_.shared_alloc_.direct_ptr = (void *)local_4d0._8_8_;
      Mesh::add_tag<double>(local_5f8,local_3b4,(string *)pAVar25,local_61c,&local_1a0,false);
      pAVar25 = local_1a0.write_.shared_alloc_.alloc;
      if (((ulong)local_1a0.write_.shared_alloc_.alloc & 7) == 0 &&
          (Library *)local_1a0.write_.shared_alloc_.alloc != (Library *)0x0) {
        pCVar2 = (CommPtr *)&(local_1a0.write_.shared_alloc_.alloc)->use_count;
        *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             + -1;
        if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            == 0) {
          Alloc::~Alloc(pAVar25);
          operator_delete(pAVar25,0x48);
        }
      }
      plVar8 = profile::global_singleton_history;
      if (profile::global_singleton_history != (long *)0x0) {
        local_600 = *(Mesh **)(*profile::global_singleton_history + 0x30 +
                              profile::global_singleton_history[3] * 0x40);
        b = now();
        RVar31 = operator-(b,(Impl)((Impl *)(*plVar8 + 0x28 + plVar8[3] * 0x40))->__d);
        lVar6 = *plVar8;
        lVar7 = plVar8[3];
        *(double *)(lVar6 + 0x30 + lVar7 * 0x40) = (double)local_600 + RVar31;
        plVar8[3] = *(long *)(lVar6 + lVar7 * 0x40);
      }
      uVar9 = local_4d0._0_8_;
      if ((local_4d0._0_8_ & 7) == 0 && (Alloc *)local_4d0._0_8_ != (Alloc *)0x0) {
        piVar3 = (int *)(local_4d0._0_8_ + 0x30);
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc((Alloc *)local_4d0._0_8_);
          operator_delete((void *)uVar9,0x48);
        }
      }
      if (((ulong)local_130 & 7) == 0 && local_130 != (element_type *)0x0) {
        pLVar4 = local_130->items2content_;
        *(int *)&(pLVar4->write_).shared_alloc_.alloc =
             *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
        if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
          Alloc::~Alloc((Alloc *)local_130);
          operator_delete(local_130,0x48);
        }
      }
      if (((ulong)local_560.shared_alloc_.alloc & 7) == 0 &&
          (element_type *)local_560.shared_alloc_.alloc != (element_type *)0x0) {
        pLVar4 = (LOs *)&(local_560.shared_alloc_.alloc)->use_count;
        *(int *)&(pLVar4->write_).shared_alloc_.alloc =
             *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
        if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
          Alloc::~Alloc(local_560.shared_alloc_.alloc);
          operator_delete(local_560.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
        piVar3 = &local_120->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_120);
          operator_delete(local_120,0x48);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

static void transfer_integ_error(Mesh* old_mesh, Mesh* new_mesh,
    CavsByBdryStatus const& cavs, Reals old_elem_densities,
    Reals new_elem_densities, std::string const& error_name,
    LOs same_ents2old_ents, LOs same_ents2new_ents,
    ConservedBools conserved_bools) {
  begin_code("transfer_integ_error");
  auto dim = old_mesh->dim();
  auto old_tag = old_mesh->get_tag<Real>(dim, error_name);
  auto ncomps = old_tag->ncomps();
  auto old_elem_errors = old_tag->array();
  auto new_elem_errors_w = Write<Real>(new_mesh->nelems() * ncomps, 0.0);
  auto same_errors = read(unmap(same_ents2old_ents, old_elem_errors, ncomps));
  map_into(same_errors, same_ents2new_ents, new_elem_errors_w, ncomps);
  for (std::size_t i = 0; i < 3; ++i) {
    if (!conserved_bools.this_time[i]) {
      for (auto class_cavs : cavs[i][CLASS_COLOR]) {
        introduce_class_integ_error(old_mesh, new_mesh, class_cavs,
            old_elem_densities, new_elem_densities, new_elem_errors_w);
      }
    }
    if (!conserved_bools.always[i]) {
      for (auto bdry_cavs : cavs[i][CLASS_COLOR]) {
        carry_class_bdry_integ_error(
            old_mesh, new_mesh, bdry_cavs, error_name, new_elem_errors_w);
      }
    }
  }
  auto new_elem_errors = Reals(new_elem_errors_w);
  new_mesh->add_tag(dim, error_name, ncomps, new_elem_errors);
  end_code();
}